

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialiterable.h
# Opt level: O2

const_iterator __thiscall QSequentialIterable::constEnd(QSequentialIterable *this)

{
  undefined8 uVar1;
  void *extraout_RDX;
  long in_FS_OFFSET;
  const_iterator cVar2;
  undefined1 local_38 [24];
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QIterable<QMetaSequence>::constEnd((QIterable<QMetaSequence> *)local_38);
  uVar1 = local_38._8_8_;
  local_38._16_8_ = local_38._0_8_;
  local_38._8_8_ = 0;
  *(undefined8 *)&this->super_QIterable<QMetaSequence> = local_38._0_8_;
  (this->super_QIterable<QMetaSequence>).m_iterable.m_pointer.d = uVar1;
  local_20 = 0;
  QBaseIterator<QMetaSequence>::~QBaseIterator((QBaseIterator<QMetaSequence> *)(local_38 + 0x10));
  QBaseIterator<QMetaSequence>::~QBaseIterator((QBaseIterator<QMetaSequence> *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    cVar2.super_QSequentialConstIterator.super_QConstIterator<QMetaSequence>.
    super_QBaseIterator<QMetaSequence>.m_iterator = extraout_RDX;
    cVar2.super_QSequentialConstIterator.super_QConstIterator<QMetaSequence>.
    super_QBaseIterator<QMetaSequence>.m_iterable.m_pointer.d =
         (QTaggedPointer<QIterable<QMetaSequence>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaSequence>,_QIterable<QMetaSequence>_>::Tag>
          )(QTaggedPointer<QIterable<QMetaSequence>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaSequence>,_QIterable<QMetaSequence>_>::Tag>
            )this;
    return (const_iterator)
           cVar2.super_QSequentialConstIterator.super_QConstIterator<QMetaSequence>.
           super_QBaseIterator<QMetaSequence>;
  }
  __stack_chk_fail();
}

Assistant:

const_iterator constEnd() const { return const_iterator(QIterable::constEnd()); }